

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool has_teleport_destination_prereqs(chunk *c,loc grid,_Bool is_player_moving)

{
  _Bool _Var1;
  square *psVar2;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,is_player_moving) == 0) {
    _Var1 = square_is_monster_walkable((chunk_conflict *)c,grid);
    if (!_Var1) {
      return false;
    }
    _Var1 = square_iswarded((chunk_conflict *)c,grid);
  }
  else {
    _Var1 = square_ispassable((chunk_conflict *)c,grid);
    if (!_Var1) {
      return false;
    }
    _Var1 = square_isplayertrap((chunk_conflict *)c,grid);
  }
  if ((((_Var1 == false) && (psVar2 = square((chunk_conflict *)c,grid), psVar2->mon == 0)) &&
      (_Var1 = square_isdamaging((chunk_conflict *)c,grid), !_Var1)) &&
     ((_Var1 = square_isfall((chunk_conflict *)c,grid), !_Var1 &&
      (_Var1 = square_iswebbed((chunk_conflict *)c,grid), !_Var1)))) {
    _Var1 = square_isshop((chunk_conflict *)c,grid);
    return !_Var1;
  }
  return false;
}

Assistant:

static bool has_teleport_destination_prereqs(struct chunk *c, struct loc grid,
		bool is_player_moving)
{
	if (is_player_moving) {
		if (!square_ispassable(c, grid)) {
			return false;
		}
		if (square_isplayertrap(c, grid)) {
			return false;
		}
	} else {
		if (!square_is_monster_walkable(c, grid)) {
			return false;
		}
		if (square_iswarded(c, grid)) {
			return false;
		}
	}
	if (square(c, grid)->mon
			|| square_isdamaging(c, grid)
			|| square_isfall(c, grid)
			|| square_iswebbed(c, grid)
			|| square_isshop(c, grid)) {
		return false;
	}
	return true;
}